

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar xmlPopInput(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->inputNr < 2)) {
    ctxt_local._7_1_ = '\0';
  }
  else {
    input_00 = xmlCtxtPopInput(ctxt);
    xmlFreeInputStream(input_00);
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    ctxt_local._7_1_ = *ctxt->input->cur;
  }
  return ctxt_local._7_1_;
}

Assistant:

xmlChar
xmlPopInput(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ctxt->inputNr <= 1)) return(0);
    input = xmlCtxtPopInput(ctxt);
    xmlFreeInputStream(input);
    if (*ctxt->input->cur == 0)
        xmlParserGrow(ctxt);
    return(CUR);
}